

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O0

int cmd_load(char *arg)

{
  size_t sVar1;
  lys_module *__haystack;
  char *pcVar2;
  long lVar3;
  lys_module *model;
  char *arg_ptr;
  char *s;
  char *name;
  int ret;
  int name_len;
  char *arg_local;
  
  name._0_4_ = 1;
  sVar1 = strlen(arg);
  if (sVar1 < 6) {
    cmd_load_help();
    arg_local._4_4_ = 1;
  }
  else {
    __haystack = (lys_module *)strdup(arg + 4);
    for (arg_ptr = strstr((char *)__haystack,"-i"); model = __haystack, arg_ptr != (char *)0x0;
        arg_ptr = strstr(arg_ptr + 2,"-i")) {
      if ((arg_ptr[2] == '\0') || (arg_ptr[2] == ' ')) {
        ly_ctx_set_allimplemented(ctx);
        arg_ptr[1] = ' ';
        *arg_ptr = ' ';
      }
    }
    for (; *(char *)&model->ctx == ' '; model = (lys_module *)((long)&model->ctx + 1)) {
    }
    pcVar2 = strchr((char *)model,0x20);
    if (pcVar2 == (char *)0x0) {
      sVar1 = strlen((char *)model);
      name._4_4_ = (int)sVar1;
    }
    else {
      pcVar2 = strchr((char *)model,0x20);
      name._4_4_ = (int)pcVar2 - (int)model;
    }
    s = strndup((char *)model,(long)name._4_4_);
    while (s != (char *)0x0) {
      lVar3 = ly_ctx_load_module(ctx,s,0);
      free(s);
      if (lVar3 == 0) goto LAB_0010805d;
      for (model = (lys_module *)(model->padding2 + (long)name._4_4_ + -0x42);
          *(char *)&model->ctx == ' '; model = (lys_module *)((long)&model->ctx + 1)) {
      }
      pcVar2 = strchr((char *)model,0x20);
      if (pcVar2 == (char *)0x0) {
        sVar1 = strlen((char *)model);
        name._4_4_ = (int)sVar1;
      }
      else {
        pcVar2 = strchr((char *)model,0x20);
        name._4_4_ = (int)pcVar2 - (int)model;
      }
      if (name._4_4_ == 0) {
        s = (char *)0x0;
      }
      else {
        s = strndup((char *)model,(long)name._4_4_);
      }
    }
    name._0_4_ = 0;
LAB_0010805d:
    free(__haystack);
    ly_ctx_unset_allimplemented(ctx);
    arg_local._4_4_ = (int)name;
  }
  return arg_local._4_4_;
}

Assistant:

int
cmd_load(const char *arg)
{
    int name_len, ret = 1;
    char *name, *s, *arg_ptr;
    const struct lys_module *model;

    if (strlen(arg) < 6) {
        cmd_load_help();
        return 1;
    }

    arg_ptr = strdup(arg + 4 /* ignore "load" */);

    for (s = strstr(arg_ptr, "-i"); s ; s = strstr(s + 2, "-i")) {
        if (s[2] == '\0' || s[2] == ' ') {
            ly_ctx_set_allimplemented(ctx);
            s[0] = s[1] = ' ';
        }
    }
    s = arg_ptr;

    while (arg_ptr[0] == ' ') {
        ++arg_ptr;
    }
    if (strchr(arg_ptr, ' ')) {
        name_len = strchr(arg_ptr, ' ') - arg_ptr;
    } else {
        name_len = strlen(arg_ptr);
    }
    name = strndup(arg_ptr, name_len);

    while (name) {
        model = ly_ctx_load_module(ctx, name, NULL);
        free(name);
        if (!model) {
            /* libyang printed the error messages */
            goto cleanup;
        }

        /* next model */
        arg_ptr += name_len;
        while (arg_ptr[0] == ' ') {
            ++arg_ptr;
        }
        if (strchr(arg_ptr, ' ')) {
            name_len = strchr(arg_ptr, ' ') - arg_ptr;
        } else {
            name_len = strlen(arg_ptr);
        }

        if (name_len) {
            name = strndup(arg_ptr, name_len);
        } else {
            name = NULL;
        }
    }
    ret = 0;

cleanup:
    free(s);
    ly_ctx_unset_allimplemented(ctx);

    return ret;
}